

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O0

Trampoline * __thiscall
ReferenceMeaning::Eval(Trampoline *__return_storage_ptr__,ReferenceMeaning *this,Sexp *act)

{
  bool expr;
  Sexp *value;
  ContractFrameProtector local_20;
  ContractFrameProtector __contract_frame;
  Sexp *act_local;
  ReferenceMeaning *this_local;
  
  __contract_frame.protected_frame = (ContractFrame *)act;
  ContractFrameProtector::ContractFrameProtector(&local_20,"Eval");
  ContractFrameProtector::AddContract(&local_20,NoGc);
  expr = Sexp::IsActivation((Sexp *)__contract_frame.protected_frame);
  ContractFrameProtector::CheckPrecondition(&local_20,expr,"act->IsActivation()");
  value = Activation::Get((Activation *)(__contract_frame.protected_frame)->function_name,
                          this->up_index,this->right_index);
  Trampoline::Trampoline(__return_storage_ptr__,value);
  ContractFrameProtector::~ContractFrameProtector(&local_20);
  return __return_storage_ptr__;
}

Assistant:

Trampoline ReferenceMeaning::Eval(Sexp *act) {
  CONTRACT {
    FORBID_GC;
    PRECONDITION(act->IsActivation());
  }